

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_wallmarks.cxx
# Opt level: O2

void __thiscall read_slot_1::operator()(read_slot_1 *this,wm_slot_le **_slot,xr_reader *r)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  wm_slot_le *value;
  
  value = (wm_slot_le *)operator_new(0x58);
  (value->shader)._M_dataplus._M_p = (pointer)&(value->shader).field_2;
  (value->shader)._M_string_length = 0;
  (value->shader).field_2._M_local_buf[0] = '\0';
  (value->texture)._M_dataplus._M_p = (pointer)&(value->texture).field_2;
  (value->texture)._M_string_length = 0;
  (value->texture).field_2._M_local_buf[0] = '\0';
  (value->wallmarks).super__Vector_base<xray_re::wm_object,_std::allocator<xray_re::wm_object>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (value->wallmarks).super__Vector_base<xray_re::wm_object,_std::allocator<xray_re::wm_object>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (value->wallmarks).super__Vector_base<xray_re::wm_object,_std::allocator<xray_re::wm_object>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *_slot = value;
  puVar2 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  uVar1 = *puVar2;
  xray_re::xr_reader::r_sz(r,(string *)value);
  xray_re::xr_reader::r_sz(r,&value->texture);
  xray_re::xr_reader::
  r_seq<std::vector<xray_re::wm_object,std::allocator<xray_re::wm_object>>,read_wallmark>
            (r,uVar1,&value->wallmarks);
  return;
}

Assistant:

void operator()(wm_slot_le*& _slot, xr_reader& r) const {
	wm_slot_le* slot = new wm_slot_le;
	_slot = slot;
	size_t n = r.r_u32();
	r.r_sz(slot->shader);
	r.r_sz(slot->texture);
	r.r_seq(n, slot->wallmarks, read_wallmark());
}